

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *prop,string *value)

{
  bool bVar1;
  CacheEntryType CVar2;
  
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    CVar2 = cmState::StringToCacheEntryType(value);
    this->Type = CVar2;
    return;
  }
  bVar1 = std::operator==(prop,"VALUE");
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)this);
    return;
  }
  cmPropertyMap::SetProperty(&this->Properties,prop,(cmValue)value);
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& prop,
                                             const std::string& value)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType(value);
  } else if (prop == "VALUE") {
    this->Value = value;
  } else {
    this->Properties.SetProperty(prop, value);
  }
}